

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O1

bool SetDevice(char *const_id,aint ramtop)

{
  uint uVar1;
  int iVar2;
  CDevice *pCVar3;
  char *pcVar4;
  size_t sVar5;
  CDeviceSlot *pCVar6;
  aint ramtop_00;
  undefined8 in_R8;
  CDevice **dev;
  CDevice *pCVar7;
  CDevice *pCVar8;
  long lVar9;
  bool bVar10;
  char *id;
  char buf [2048];
  char *local_840;
  char local_838 [2056];
  
  if (const_id != (char *)0x0) {
    local_840 = const_id;
    iVar2 = cmphstr(&local_840,"none",false);
    if (iVar2 == 0) {
      if ((DeviceID == (char *)0x0) || (iVar2 = strcmp(DeviceID,local_840), iVar2 != 0)) {
        pcVar4 = local_840;
        pCVar8 = Devices;
        ramtop_00 = (aint)in_R8;
        DeviceID = (char *)0x0;
        dev = &Devices;
        bVar10 = Devices == (CDevice *)0x0;
        if (bVar10) {
          pCVar8 = (CDevice *)0x0;
        }
        else {
          iVar2 = strcmp(Devices->ID,local_840);
          ramtop_00 = (aint)in_R8;
          if (iVar2 != 0) {
            do {
              pCVar7 = pCVar8;
              ramtop_00 = (aint)in_R8;
              pCVar3 = pCVar7->Next;
              bVar10 = pCVar3 == (CDevice *)0x0;
              pCVar8 = pCVar7;
              if (bVar10) break;
              iVar2 = strcmp(pCVar3->ID,pcVar4);
              ramtop_00 = (aint)in_R8;
              pCVar8 = pCVar3;
            } while (iVar2 != 0);
            dev = &pCVar7->Next;
          }
        }
        if (bVar10) {
          iVar2 = cmphstr(&local_840,"zxspectrum48",false);
          if (iVar2 == 0) {
            iVar2 = cmphstr(&local_840,"zxspectrum128",false);
            if (iVar2 == 0) {
              iVar2 = cmphstr(&local_840,"zxspectrum256",false);
              if (iVar2 == 0) {
                iVar2 = cmphstr(&local_840,"zxspectrum512",false);
                if (iVar2 == 0) {
                  iVar2 = cmphstr(&local_840,"zxspectrum1024",false);
                  if (iVar2 == 0) {
                    iVar2 = cmphstr(&local_840,"zxspectrum2048",false);
                    if (iVar2 == 0) {
                      iVar2 = cmphstr(&local_840,"zxspectrum4096",false);
                      if (iVar2 == 0) {
                        iVar2 = cmphstr(&local_840,"zxspectrum8192",false);
                        if (iVar2 == 0) {
                          iVar2 = cmphstr(&local_840,"zxspectrumnext",false);
                          if (iVar2 == 0) {
                            iVar2 = cmphstr(&local_840,"noslot64k",false);
                            if (iVar2 == 0) {
                              iVar2 = cmphstr(&local_840,"amstradcpc464",false);
                              if (iVar2 == 0) {
                                iVar2 = cmphstr(&local_840,"amstradcpc6128",false);
                                if (iVar2 == 0) {
                                  iVar2 = cmphstr(&local_840,"amstradcpcplus",false);
                                  if (iVar2 == 0) {
                                    bVar10 = SetUserDefinedDevice(local_840,dev,pCVar8,ramtop);
                                    if (!bVar10) {
                                      return false;
                                    }
                                  }
                                  else {
                                    DeviceAmstradCPCPLUS(dev,pCVar8,ramtop);
                                  }
                                }
                                else {
                                  DeviceAmstradCPC6128(dev,pCVar8,ramtop);
                                }
                              }
                              else {
                                DeviceAmstradCPC464(dev,pCVar8,ramtop);
                              }
                            }
                            else {
                              DeviceNoSlot64k(dev,pCVar8,ramtop);
                            }
                          }
                          else {
                            DeviceZxSpectrumNext(dev,pCVar8,ramtop);
                          }
                        }
                        else {
                          DeviceZXSpectrum8192(dev,pCVar8,ramtop);
                        }
                      }
                      else {
                        DeviceZXSpectrum4096(dev,pCVar8,ramtop);
                      }
                    }
                    else {
                      DeviceZXSpectrum2048(dev,pCVar8,ramtop);
                    }
                  }
                  else {
                    DeviceZXSpectrum1024(dev,pCVar8,ramtop);
                  }
                }
                else {
                  DeviceZXSpectrum512(dev,pCVar8,ramtop);
                }
              }
              else {
                DeviceZXSpectrum256(dev,pCVar8,ramtop);
              }
            }
            else {
              DeviceZXSpectrum128(dev,pCVar8,ramtop);
            }
          }
          else {
            pCVar3 = (CDevice *)operator_new(0x2838);
            pCVar3->Next = (CDevice *)0x0;
            pCVar3->SlotsCount = 0;
            pCVar3->PagesCount = 0;
            pCVar3->Memory = (byte *)0x0;
            pCVar3->ZxRamTop = 0;
            pCVar3->CurrentSlot = 0;
            pCVar3->previousSlotI = 0;
            pCVar3->previousSlotOpt = O_NONE;
            pCVar3->limitExceeded = false;
            pcVar4 = strdup("ZXSPECTRUM48");
            pCVar3->ID = pcVar4;
            if (pCVar8 != (CDevice *)0x0) {
              pCVar8->Next = pCVar3;
            }
            memset(pCVar3->Slots,0,0x2800);
            *dev = pCVar3;
            initZxLikeDevice(pCVar3,4,0x15f630,(int *)(ulong)(uint)ramtop,ramtop_00);
          }
        }
        Device = *dev;
        DeviceID = Device->ID;
        CDevice::CheckPage(Device,CHECK_RESET);
      }
      if ((ramtop != 0) && (Device->ZxRamTop != ramtop && Device->ZxRamTop != 0)) {
        WarningById(W_DEV_RAMTOP,(char *)0x0,W_PASS3);
      }
      bVar10 = IsSldExportActive();
      pCVar8 = Device;
      if (bVar10) {
        pCVar6 = Device->Slots[Device->CurrentSlot];
        if (pCVar6 == (CDeviceSlot *)0x0) {
          Error("Wrong slot number",lp,PASS3);
          pCVar6 = pCVar8->Slots[0];
        }
        uVar1 = Device->SlotsCount;
        snprintf(local_838,0x800,"pages.size:%d,pages.count:%d,slots.count:%d",
                 (ulong)(uint)pCVar6->Size,(ulong)(uint)Device->PagesCount,(ulong)uVar1);
        if (0 < (long)(int)uVar1) {
          lVar9 = 0;
          do {
            sVar5 = strlen(local_838);
            pCVar8 = Device;
            pcVar4 = ",%d";
            if (lVar9 == 0) {
              pcVar4 = ",slots.adr:%d";
            }
            pCVar6 = Device->Slots[lVar9];
            if (pCVar6 == (CDeviceSlot *)0x0) {
              Error("Wrong slot number",lp,PASS3);
              pCVar6 = pCVar8->Slots[0];
            }
            snprintf(local_838 + sVar5,0x800 - sVar5,pcVar4,(ulong)(uint)pCVar6->Address);
            lVar9 = lVar9 + 1;
          } while ((int)uVar1 != lVar9);
        }
        WriteToSldFile(-1,-1,'Z',local_838);
        return true;
      }
      return true;
    }
  }
  DeviceID = (char *)0x0;
  Device = (CDevice *)0x0;
  return true;
}

Assistant:

bool SetDevice(const char *const_id, const aint ramtop) {
	CDevice** dev;
	CDevice* parent = nullptr;
	char* id = const_cast<char*>(const_id);		//TODO cmphstr for both const/nonconst variants?
		// ^ argument is const because of lua bindings

	if (!id || cmphstr(id, "none")) {
		DeviceID = nullptr;
		Device = nullptr;
		return true;
	}

	if (!DeviceID || strcmp(DeviceID, id)) {	// different device than current, change to it
		DeviceID = nullptr;
		dev = &Devices;
		// search for device
		while (*dev) {
			parent = *dev;
			if (!strcmp(parent->ID, id)) break;
			dev = &(parent->Next);
		}
		if (nullptr == (*dev)) {	// device not found
			if (cmphstr(id, "zxspectrum48")) {			// must be lowercase to catch both cases
				DeviceZXSpectrum48(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum128")) {
				DeviceZXSpectrum128(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum256")) {
				DeviceZXSpectrum256(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum512")) {
				DeviceZXSpectrum512(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum1024")) {
				DeviceZXSpectrum1024(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum2048")) {
				DeviceZXSpectrum2048(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum4096")) {
				DeviceZXSpectrum4096(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum8192")) {
				DeviceZXSpectrum8192(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrumnext")) {
				DeviceZxSpectrumNext(dev, parent, ramtop);
			} else if (cmphstr(id, "noslot64k")) {
				DeviceNoSlot64k(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpc464")) {
				DeviceAmstradCPC464(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpc6128")) {
				DeviceAmstradCPC6128(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpcplus")) {
				DeviceAmstradCPCPLUS(dev, parent, ramtop);
			} else if (!SetUserDefinedDevice(id, dev, parent, ramtop)) {
				return false;
			}
		}
		// set up the found/new device
		Device = (*dev);
		DeviceID = Device->ID;
		Device->CheckPage(CDevice::CHECK_RESET);
	}
	if (ramtop && Device->ZxRamTop && ramtop != Device->ZxRamTop) {
		WarningById(W_DEV_RAMTOP);
	}
	if (IsSldExportActive()) {
		// SLD tracing data are being exported, export the device data
		int pageSize = Device->GetCurrentSlot()->Size;
		int pageCount = Device->PagesCount;
		int slotsCount = Device->SlotsCount;
		char buf[LINEMAX];
		snprintf(buf, LINEMAX, "pages.size:%d,pages.count:%d,slots.count:%d",
			pageSize, pageCount, slotsCount
		);
		for (int slotI = 0; slotI < slotsCount; ++slotI) {
			size_t bufLen = strlen(buf);
			char* bufAppend = buf + bufLen;
			snprintf(bufAppend, LINEMAX-bufLen,
						(0 == slotI) ? ",slots.adr:%d" : ",%d",
						Device->GetSlot(slotI)->Address);
		}
		// pagesize
		WriteToSldFile(-1,-1,'Z',buf);
	}
	return true;
}